

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_elements_transaction.cpp
# Opt level: O0

void __thiscall
cfd::core::ConfidentialTxOut::ConfidentialTxOut
          (ConfidentialTxOut *this,Script *locking_script,ConfidentialAssetId *asset,
          ConfidentialValue *confidential_value,ConfidentialNonce *nonce,ByteData *surjection_proof,
          ByteData *range_proof)

{
  Amount AVar1;
  ByteData *in_stack_ffffffffffffff68;
  ByteData *this_00;
  Amount local_48;
  ByteData *local_38;
  ByteData *surjection_proof_local;
  ConfidentialNonce *nonce_local;
  ConfidentialValue *confidential_value_local;
  ConfidentialAssetId *asset_local;
  Script *locking_script_local;
  ConfidentialTxOut *this_local;
  
  local_38 = surjection_proof;
  surjection_proof_local = (ByteData *)nonce;
  nonce_local = (ConfidentialNonce *)confidential_value;
  confidential_value_local = (ConfidentialValue *)asset;
  asset_local = (ConfidentialAssetId *)locking_script;
  locking_script_local = (Script *)this;
  AVar1 = Amount::CreateBySatoshiAmount(0);
  local_48.amount_ = AVar1.amount_;
  local_48.ignore_check_ = AVar1.ignore_check_;
  AbstractTxOut::AbstractTxOut(&this->super_AbstractTxOut,&local_48,(Script *)asset_local);
  (this->super_AbstractTxOut)._vptr_AbstractTxOut = (_func_int **)&PTR__ConfidentialTxOut_009f83a0;
  ConfidentialAssetId::ConfidentialAssetId
            (&this->asset_,(ConfidentialAssetId *)confidential_value_local);
  ConfidentialValue::ConfidentialValue(&this->confidential_value_,(ConfidentialValue *)nonce_local);
  ConfidentialNonce::ConfidentialNonce(&this->nonce_,(ConfidentialNonce *)surjection_proof_local);
  this_00 = &this->surjection_proof_;
  ByteData::ByteData(this_00,in_stack_ffffffffffffff68);
  ByteData::ByteData(this_00,in_stack_ffffffffffffff68);
  return;
}

Assistant:

ConfidentialTxOut::ConfidentialTxOut(
    const Script &locking_script, const ConfidentialAssetId &asset,
    const ConfidentialValue &confidential_value,
    const ConfidentialNonce &nonce, const ByteData &surjection_proof,
    const ByteData &range_proof)
    : AbstractTxOut(Amount::CreateBySatoshiAmount(0), locking_script),
      asset_(asset),
      confidential_value_(confidential_value),
      nonce_(nonce),
      surjection_proof_(surjection_proof),
      range_proof_(range_proof) {
  // do nothing
}